

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderSwitchTests.cpp
# Opt level: O3

void deqp::evalSwitchDynamic(ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  long lVar2;
  float fVar3;
  float afStack_38 [5];
  float local_24;
  int aiStack_20 [6];
  
  local_24 = (evalCtx->coords).m_data[2];
  fVar3 = floorf(local_24 * 1.5 + 2.0);
  switch((int)fVar3) {
  case 0:
    uVar1 = *(undefined8 *)(evalCtx->coords).m_data;
    afStack_38[2] = (float)uVar1;
    afStack_38[3] = (float)((ulong)uVar1 >> 0x20);
    afStack_38[4] = local_24;
    aiStack_20[2] = 0;
    aiStack_20[3] = 1;
    aiStack_20[4] = 2;
    lVar2 = 2;
    do {
      (evalCtx->color).m_data[aiStack_20[lVar2]] = afStack_38[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
    break;
  case 1:
    afStack_38[2] = (evalCtx->coords).m_data[3];
    afStack_38[3] = local_24;
    afStack_38[4] = (evalCtx->coords).m_data[1];
    aiStack_20[2] = 0;
    aiStack_20[3] = 1;
    aiStack_20[4] = 2;
    lVar2 = 2;
    do {
      (evalCtx->color).m_data[aiStack_20[lVar2]] = afStack_38[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
    break;
  case 2:
    afStack_38[2] = (evalCtx->coords).m_data[1];
    afStack_38[3] = local_24;
    afStack_38[4] = (evalCtx->coords).m_data[3];
    aiStack_20[2] = 0;
    aiStack_20[3] = 1;
    aiStack_20[4] = 2;
    lVar2 = 2;
    do {
      (evalCtx->color).m_data[aiStack_20[lVar2]] = afStack_38[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
    break;
  case 3:
    afStack_38[2] = local_24;
    uVar1 = *(undefined8 *)(evalCtx->coords).m_data;
    afStack_38[3] = (float)(int)((ulong)uVar1 >> 0x20);
    afStack_38[4] = (float)(int)uVar1;
    aiStack_20[2] = 0;
    aiStack_20[3] = 1;
    aiStack_20[4] = 2;
    lVar2 = 2;
    do {
      (evalCtx->color).m_data[aiStack_20[lVar2]] = afStack_38[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
    break;
  default:
    afStack_38[2] = (evalCtx->coords).m_data[0];
    afStack_38[3] = afStack_38[2];
    afStack_38[4] = afStack_38[2];
    aiStack_20[2] = 0;
    aiStack_20[3] = 1;
    aiStack_20[4] = 2;
    lVar2 = 2;
    do {
      (evalCtx->color).m_data[aiStack_20[lVar2]] = afStack_38[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 5);
  }
  return;
}

Assistant:

static void evalSwitchDynamic(ShaderEvalContext& evalCtx)
{
	switch (int(deFloatFloor(evalCtx.coords.z() * 1.5f + 2.0f)))
	{
	case 0:
		evalCtx.color.xyz() = evalCtx.coords.swizzle(0, 1, 2);
		break;
	case 1:
		evalCtx.color.xyz() = evalCtx.coords.swizzle(3, 2, 1);
		break;
	case 2:
		evalCtx.color.xyz() = evalCtx.coords.swizzle(1, 2, 3);
		break;
	case 3:
		evalCtx.color.xyz() = evalCtx.coords.swizzle(2, 1, 0);
		break;
	default:
		evalCtx.color.xyz() = evalCtx.coords.swizzle(0, 0, 0);
		break;
	}
}